

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::
visit_uint64(basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>
             *this,uint64_t value,semantic_tag param_3,ser_context *param_4,error_code *param_5)

{
  bool bVar1;
  reference pvVar2;
  size_t sVar3;
  stream_sink<char> *in_RCX;
  vector<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
  *in_RDI;
  undefined8 in_R8;
  stream_sink<char> *in_stack_00000138;
  unsigned_long in_stack_00000140;
  char ch;
  
  ch = (char)((ulong)in_R8 >> 0x38);
  bVar1 = std::
          vector<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
          ::empty((vector<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
                   *)in_RCX);
  if (!bVar1) {
    pvVar2 = std::
             vector<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
             ::back(in_RDI);
    bVar1 = encoding_context::is_array(pvVar2);
    if (bVar1) {
      pvVar2 = std::
               vector<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
               ::back(in_RDI);
      sVar3 = encoding_context::count(pvVar2);
      if (sVar3 != 0) {
        stream_sink<char>::push_back(in_RCX,ch);
      }
    }
  }
  detail::from_integer<unsigned_long,jsoncons::stream_sink<char>>
            (in_stack_00000140,in_stack_00000138);
  bVar1 = std::
          vector<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
          ::empty((vector<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
                   *)in_RCX);
  if (!bVar1) {
    pvVar2 = std::
             vector<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
             ::back(in_RDI);
    encoding_context::increment_count(pvVar2);
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_uint64(uint64_t value, 
                             semantic_tag, 
                             const ser_context&,
                             std::error_code&) final
        {
            if (!stack_.empty() && stack_.back().is_array() && stack_.back().count() > 0)
            {
                sink_.push_back(',');
            }
            jsoncons::detail::from_integer(value, sink_);
            if (!stack_.empty())
            {
                stack_.back().increment_count();
            }
            JSONCONS_VISITOR_RETURN;
        }